

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(unsigned_short lhs,SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs
         )

{
  bool bVar1;
  char cVar2;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> in_SIL;
  unsigned_short in_DI;
  unsigned_short unaff_retaddr;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> unaff_retaddr_00;
  unsigned_short ret;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  unsigned_short *in_stack_ffffffffffffffe8;
  undefined5 in_stack_fffffffffffffff0;
  undefined1 in_stack_fffffffffffffff5;
  undefined2 uVar3;
  undefined1 in_stack_fffffffffffffff8;
  undefined1 in_stack_fffffffffffffff9;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> in_stack_fffffffffffffffb;
  char in_stack_ffffffffffffffff;
  
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt
            ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
             &stack0xfffffffffffffffb);
  bVar1 = DivisionCornerCaseHelper<char,_unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase1
                    (unaff_retaddr,unaff_retaddr_00,
                     (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                     CONCAT17(in_stack_ffffffffffffffff,
                              CONCAT16(in_SIL.m_int,
                                       CONCAT24(in_DI,CONCAT13(in_stack_fffffffffffffffb.m_int,
                                                               CONCAT12(in_SIL.m_int,
                                                                        CONCAT11(
                                                  in_stack_fffffffffffffff9,
                                                  in_stack_fffffffffffffff8)))))));
  if ((!bVar1) &&
     (bVar1 = DivisionCornerCaseHelper2<char,_unsigned_short,_safeint_exception_handlers::SafeInt_InvalidParameter,_0>
              ::DivisionCornerCase2
                        (in_DI,in_SIL,
                         (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                         &stack0xfffffffffffffffb), !bVar1)) {
    uVar3 = 0;
    cVar2 = SafeInt::operator_cast_to_char
                      ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
                       (ulong)CONCAT15(in_stack_fffffffffffffff5,in_stack_fffffffffffffff0));
    DivisionHelper<unsigned_short,_char,_1>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>
              ((unsigned_short *)CONCAT26(uVar3,CONCAT15(cVar2,in_stack_fffffffffffffff0)),
               (char *)in_stack_ffffffffffffffe8,(unsigned_short *)0x114044);
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<unsigned_short>
              ((SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *)
               CONCAT26(uVar3,CONCAT15(cVar2,in_stack_fffffffffffffff0)),in_stack_ffffffffffffffe8);
    in_stack_fffffffffffffffb.m_int = in_stack_ffffffffffffffff;
  }
  return (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)
         in_stack_fffffffffffffffb.m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}